

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O3

void __thiscall slang::ast::ConfigBlockSymbol::resolve(ConfigBlockSymbol *this)

{
  SyntaxNode **this_00;
  Symbol **this_01;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
  *arrays_;
  long *plVar1;
  size_t *psVar2;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar3;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  char *pcVar5;
  group_type_pointer pgVar6;
  group_type_pointer pgVar7;
  SymbolKind SVar8;
  ParameterValueAssignmentSyntax *pPVar9;
  size_type sVar10;
  value_type_pointer ppVar11;
  int *piVar12;
  group_type_pointer pgVar13;
  value_type_pointer ppVar14;
  value_type_pointer ppVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ushort uVar20;
  SourceLocation SVar21;
  SourceLocation SVar22;
  SyntaxKind *pSVar23;
  TokenKind *pTVar24;
  Scope *pSVar25;
  _Alloc_hider _Var26;
  value_type_pointer ppVar27;
  undefined8 uVar28;
  value_type_pointer ppVar29;
  bool bVar30;
  int iVar31;
  undefined4 extraout_var;
  undefined4 uVar32;
  char_pointer puVar33;
  DefinitionSymbol *pDVar34;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 pos0;
  SourceLocation SVar35;
  Diagnostic *pDVar36;
  ConfigRule *pCVar37;
  uint64_t uVar38;
  ulong extraout_RAX;
  ulong pos0_00;
  ulong extraout_RAX_00;
  ulong uVar39;
  char_pointer puVar40;
  char_pointer puVar41;
  pointer pPVar42;
  char_pointer puVar43;
  size_t extraout_RDX;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
  *ptVar45;
  table_element_pointer extraout_RDX_00;
  table_element_pointer extraout_RDX_01;
  size_type __rlen_4;
  undefined8 *puVar46;
  char_pointer puVar47;
  slot_type *psVar48;
  group_type_pointer pgVar49;
  size_t sVar50;
  long lVar51;
  ulong hash;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  long lVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  Token *pTVar56;
  uint uVar57;
  ConfigUseClauseSyntax *cuc;
  SyntaxNode *pSVar58;
  SourceLocation *pSVar59;
  table_element_pointer ppVar60;
  pointer pTVar61;
  char_pointer puVar62;
  size_type __rlen_2;
  slot_type *psVar63;
  size_type __rlen;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *ppVar64;
  pointer pTVar65;
  table_element_pointer ppVar66;
  char cVar67;
  uchar uVar68;
  char cVar82;
  char cVar84;
  byte bVar86;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  uchar uVar83;
  uchar uVar85;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  string_view fmt;
  string_view fmt_00;
  iterator iVar97;
  iterator iVar98;
  iterator iVar99;
  string_view libName;
  span<const_slang::SourceLibrary_*,_18446744073709551615UL> sVar100;
  string_view sVar101;
  SourceRange SVar102;
  iterator iVar103;
  format_args args;
  format_args args_00;
  value_type *elements;
  string_view cellName;
  string_view topName;
  value_type *elements_2;
  ConfigInstanceIdentifierSyntax **part;
  value_type *elements_1;
  Scope *scope;
  size_t pos;
  ConfigRule *rule_1;
  locator res;
  SourceLibrary *specificLib;
  anon_class_16_2_f7902cf0 buildLiblist;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_2UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
  topCellNames;
  SmallVector<slang::ast::ConfigBlockSymbol::TopCell,_2UL> topCellsBuf;
  string local_338;
  string_view local_310;
  value_type_pointer local_300;
  undefined1 local_2f8 [16];
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
  *local_2e8;
  Token *local_2e0;
  group_type_pointer local_2d8;
  pointer local_2d0;
  Compilation *local_2c8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *local_2c0;
  Scope *local_2b8;
  SyntaxNode *local_2b0;
  undefined1 local_2a8 [16];
  group_type_pointer local_290;
  undefined1 local_288 [16];
  DefinitionSymbol *local_278;
  ConfigRule *local_270;
  _Storage<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true> local_268;
  SourceLocation local_258;
  string_view local_250;
  string_view local_240;
  SourceRange local_230;
  undefined1 local_220;
  SourceLocation local_218;
  SourceLocation local_210;
  undefined1 local_208;
  pointer local_200;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_1f8;
  SourceLibrary *local_1f0;
  anon_class_16_2_f7902cf0 local_1e8;
  uint64_t local_1d8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
  *local_1d0;
  undefined1 local_1c8 [48];
  SourceLocation local_198;
  SourceLocation local_190;
  arrays_type local_188;
  undefined1 local_168 [16];
  anon_union_8_3_62382250_for_ParameterDecl_0 *local_150;
  ulong local_148;
  SourceRange local_140;
  SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> local_130;
  uchar local_d8;
  uchar uStack_d7;
  uchar uStack_d6;
  byte bStack_d5;
  uchar uStack_d4;
  uchar uStack_d3;
  uchar uStack_d2;
  byte bStack_d1;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  byte bStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  byte bStack_c9;
  uchar local_c8;
  uchar uStack_c7;
  uchar uStack_c6;
  byte bStack_c5;
  uchar uStack_c4;
  uchar uStack_c3;
  uchar uStack_c2;
  byte bStack_c1;
  uchar uStack_c0;
  uchar uStack_bf;
  uchar uStack_be;
  byte bStack_bd;
  uchar uStack_bc;
  uchar uStack_bb;
  uchar uStack_ba;
  byte bStack_b9;
  uchar local_b8;
  uchar uStack_b7;
  uchar uStack_b6;
  uchar uStack_b5;
  uchar uStack_b4;
  uchar uStack_b3;
  uchar uStack_b2;
  uchar uStack_b1;
  uchar uStack_b0;
  uchar uStack_af;
  uchar uStack_ae;
  uchar uStack_ad;
  uchar uStack_ac;
  uchar uStack_ab;
  uchar uStack_aa;
  byte bStack_a9;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  byte bStack_99;
  char local_98;
  char cStack_97;
  char cStack_96;
  byte bStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  byte bStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  byte bStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  byte bStack_89;
  uchar local_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  uchar uStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  uchar uStack_79;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  uchar uStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  uchar uStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  uchar uStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  uchar uStack_69;
  char local_68;
  char cStack_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  byte bStack_59;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  table_element_pointer ppVar44;
  
  this->resolved = true;
  local_2b8 = (this->super_Symbol).parentScope;
  local_2c8 = local_2b8->compilation;
  local_2b0 = (this->super_Symbol).originatingSyntax;
  local_198 = (SourceLocation)local_1c8;
  local_188.groups_size_index = 0x3f;
  local_188.groups_size_mask = 1;
  local_188.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_188.elements_ =
       (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *)0x0;
  local_168 = (undefined1  [16])0x0;
  local_130.data_ = (pointer)local_130.firstElement;
  local_130.len = 0;
  local_130.cap = 2;
  local_190 = local_198;
  if (local_2b0[10].parent != (SyntaxNode *)0x0) {
    puVar46 = *(undefined8 **)(local_2b0 + 10);
    local_2e8 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                 *)(puVar46 + (long)local_2b0[10].parent);
    do {
      pSVar58 = (SyntaxNode *)*puVar46;
      this_00 = &pSVar58[2].parent;
      sVar101 = parsing::Token::valueText((Token *)this_00);
      local_338._0_16_ = sVar101;
      local_2e0 = (Token *)this_00;
      if (sVar101._M_len != 0) {
        libName = parsing::Token::valueText((Token *)(pSVar58 + 1));
        in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)libName._M_str;
        local_140 = slang::syntax::SyntaxNode::sourceRange(pSVar58);
        pDVar34 = Compilation::getDefinition(local_2c8,this,sVar101,libName,local_140);
        if (pDVar34 != (DefinitionSymbol *)0x0) {
          local_1e8.comp = (Compilation *)local_130.len;
          local_278 = pDVar34;
          local_2c0 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                       *)hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                         operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                     *)&local_190,
                                    (basic_string_view<char,_std::char_traits<char>_> *)&local_338);
          ppVar29 = local_188.elements_;
          pgVar49 = (group_type_pointer)
                    ((ulong)local_2c0 >> ((byte)local_188.groups_size_index & 0x3f));
          uVar32 = (&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     match_word(unsigned_long)::word)[(ulong)local_2c0 & 0xff];
          auVar87._4_4_ = uVar32;
          auVar87._0_4_ = uVar32;
          auVar87._8_4_ = uVar32;
          auVar87._12_4_ = uVar32;
          local_2d0 = (pointer)(ulong)((uint)local_2c0 & 7);
          _Var26._M_p = local_338._M_dataplus._M_p;
          local_2f8._0_8_ = local_338._M_string_length;
          local_290 = (group_type_pointer)local_188.groups_size_mask;
          psVar63 = (slot_type *)0x0;
          local_200 = (pointer)local_188.groups_;
          local_2d8 = pgVar49;
          do {
            local_2a8._0_8_ = pgVar49;
            paVar3 = &local_200->field_0 + (long)pgVar49 * 2;
            local_48 = *(char *)paVar3;
            cStack_47 = *(char *)((long)paVar3 + 1);
            cStack_46 = *(char *)((long)paVar3 + 2);
            cStack_45 = *(char *)((long)paVar3 + 3);
            cStack_44 = *(char *)((long)paVar3 + 4);
            cStack_43 = *(char *)((long)paVar3 + 5);
            cStack_42 = *(char *)((long)paVar3 + 6);
            cStack_41 = *(char *)((long)paVar3 + 7);
            cStack_40 = *(char *)(paVar3 + 1);
            cStack_3f = *(char *)((long)paVar3 + 9);
            cStack_3e = *(char *)((long)paVar3 + 10);
            cStack_3d = *(char *)((long)paVar3 + 0xb);
            cStack_3c = *(char *)((long)paVar3 + 0xc);
            cStack_3b = *(char *)((long)paVar3 + 0xd);
            cStack_3a = *(char *)((long)paVar3 + 0xe);
            cStack_39 = *(char *)((long)paVar3 + 0xf);
            auVar71[0] = -(local_48 == auVar87[0]);
            auVar71[1] = -(cStack_47 == auVar87[1]);
            auVar71[2] = -(cStack_46 == auVar87[2]);
            auVar71[3] = -(cStack_45 == auVar87[3]);
            auVar71[4] = -(cStack_44 == auVar87[4]);
            auVar71[5] = -(cStack_43 == auVar87[5]);
            auVar71[6] = -(cStack_42 == auVar87[6]);
            auVar71[7] = -(cStack_41 == auVar87[7]);
            auVar71[8] = -(cStack_40 == auVar87[8]);
            auVar71[9] = -(cStack_3f == auVar87[9]);
            auVar71[10] = -(cStack_3e == auVar87[10]);
            auVar71[0xb] = -(cStack_3d == auVar87[0xb]);
            auVar71[0xc] = -(cStack_3c == auVar87[0xc]);
            auVar71[0xd] = -(cStack_3b == auVar87[0xd]);
            auVar71[0xe] = -(cStack_3a == auVar87[0xe]);
            auVar71[0xf] = -(cStack_39 == auVar87[0xf]);
            local_300 = (value_type_pointer)CONCAT71(local_300._1_7_,cStack_39);
            uVar57 = (uint)(ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe);
            auVar89 = auVar87;
            auVar71 = local_288;
            for (; local_288 = auVar89, uVar57 != 0; uVar57 = uVar57 - 1 & uVar57) {
              uVar16 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              if (_Var26._M_p == (pointer)ppVar29[(long)pgVar49 * 0xf + (ulong)uVar16].first._M_len)
              {
                if (_Var26._M_p != (pointer)0x0) {
                  iVar31 = bcmp((void *)local_2f8._0_8_,
                                ppVar29[(long)pgVar49 * 0xf + (ulong)uVar16].first._M_str,
                                (size_t)_Var26._M_p);
                  auVar87 = local_288;
                  if (iVar31 != 0) goto LAB_0075f20c;
                }
                pSVar25 = local_2b8;
                SVar102 = parsing::Token::range(local_2e0);
                pDVar36 = Scope::addDiag(pSVar25,(DiagCode)0x190006,SVar102);
                Diagnostic::operator<<(pDVar36,(string_view)local_338._0_16_);
                goto LAB_0075f0bb;
              }
LAB_0075f20c:
              auVar89 = local_288;
              auVar71 = local_288;
            }
            local_288 = auVar71;
            if ((*(byte *)&((pointer)((long)local_2d0 + 0x92f880))->location & (byte)local_300) == 0
               ) break;
            psVar48 = psVar63 + local_2a8._0_8_ + 1;
            psVar63 = psVar63 + 1;
            pgVar49 = (group_type_pointer)((ulong)psVar48 & (ulong)local_290);
          } while (psVar63 <= local_290);
          if ((ulong)local_168._8_8_ < (ulong)local_168._0_8_) {
            in_R9.values_ = (value<fmt::v11::context> *)&local_310;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                      ((locator *)&local_268._M_value,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
                        *)&local_190,&local_188,(size_t)local_2d8,(size_t)local_2c0,
                       (try_emplace_args_t *)in_R9.values_,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_338,
                       (unsigned_long *)&local_1e8);
            local_168._8_8_ = local_168._8_8_ + 1;
          }
          else {
            in_R9.values_ = (value<fmt::v11::context> *)&local_1e8;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                      ((locator *)&local_268._M_value,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
                        *)&local_190,(size_t)local_2c0,(try_emplace_args_t *)&local_310,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_338,
                       (unsigned_long *)in_R9.values_);
          }
          local_268._M_value =
               (span<const_slang::SourceLibrary_*const,_18446744073709551615UL>)
               slang::syntax::SyntaxNode::sourceRange(pSVar58);
          SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::
          emplace_back<slang::ast::DefinitionSymbol_const&,slang::SourceRange>
                    (&local_130,local_278,(SourceRange *)&local_268._M_value);
        }
      }
LAB_0075f0bb:
      puVar46 = puVar46 + 1;
    } while ((table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
              *)puVar46 != local_2e8);
  }
  local_1e8.comp = local_2c8;
  local_1e8.scope = &local_2b8;
  if (local_2b0[0xd].parent != (SyntaxNode *)0x0) {
    local_2e0 = *(Token **)(local_2b0 + 0xd);
    local_2e8 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                 *)((long)local_2e0 + local_2b0[0xd].parent * 8);
    local_1f8 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                &this->instanceOverrides;
    local_200 = (pointer)&this->cellOverrides;
LAB_0075f3a6:
    pDVar34 = *(DefinitionSymbol **)local_2e0;
    SVar8 = (pDVar34->super_Symbol).kind;
    if (SVar8 == ContinuousAssign) {
      local_310 = parsing::Token::valueText
                            ((Token *)&((pDVar34->super_Symbol).nextInScope)->originatingSyntax);
      if (local_310._M_len == 0) goto LAB_0075f6a4;
      piVar12 = *(int **)&(pDVar34->super_Symbol).indexInScope;
      local_210 = *(SourceLocation *)(piVar12 + 2);
      local_258 = (SourceLocation)((ulong)local_258 & 0xffffffffffffff00);
      local_220 = 0;
      local_230.startLoc = (SourceLocation)0x0;
      local_230.endLoc = (SourceLocation)0x0;
      local_240._M_len = 0;
      local_240._M_str = (char *)0x0;
      local_250._M_len = 0;
      local_250._M_str = (char *)0x0;
      local_218 = (SourceLocation)0x0;
      local_208 = 0;
      if (*piVar12 == 99) {
        local_218 = *(SourceLocation *)(piVar12 + 0xc);
        if ((*(long *)(piVar12 + 10) != 0) &&
           (sVar101 = parsing::Token::valueText((Token *)(*(long *)(piVar12 + 10) + 0x38)),
           sVar101._M_len != 0)) {
          local_250 = parsing::Token::valueText((Token *)(*(long *)(piVar12 + 10) + 0x18));
          local_240 = parsing::Token::valueText((Token *)(*(long *)(piVar12 + 10) + 0x38));
          local_230 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(piVar12 + 10));
          if (*(long *)(piVar12 + 0x14) != 0) {
            local_220 = 1;
          }
        }
      }
      else {
        local_268._M_value =
             (span<const_slang::SourceLibrary_*const,_18446744073709551615UL>)
             resolve::anon_class_16_2_f7902cf0::operator()
                       (&local_1e8,*(ConfigLiblistSyntax **)(piVar12 + 0x14));
        local_258._0_1_ = 1;
      }
      local_270 = BumpAllocator::emplace<slang::ast::ConfigRule,slang::ast::ConfigRule>
                            (&local_2c8->super_BumpAllocator,(ConfigRule *)&local_268._M_value);
      local_2d8 = (group_type_pointer)
                  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                            ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                             local_200,&local_310);
      pgVar49 = (group_type_pointer)
                ((ulong)local_2d8 >>
                ((byte)(this->cellOverrides).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                       .arrays.groups_size_index & 0x3f));
      local_2c0 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                   *)(this->cellOverrides).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                     .arrays.groups_;
      uVar32 = (&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                 word)[(ulong)local_2d8 & 0xff];
      auVar89._4_4_ = uVar32;
      auVar89._0_4_ = uVar32;
      auVar89._8_4_ = uVar32;
      auVar89._12_4_ = uVar32;
      local_300 = (value_type_pointer)
                  (this->cellOverrides).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                  .arrays.elements_;
      sVar50 = local_310._M_len;
      local_288._0_8_ = local_310._M_str;
      local_278 = (DefinitionSymbol *)(ulong)((uint)local_2d8 & 7);
      local_2b0 = (SyntaxNode *)
                  (this->cellOverrides).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                  .arrays.groups_size_mask;
      pSVar58 = (SyntaxNode *)0x0;
      local_290 = pgVar49;
      do {
        ppVar27 = local_300;
        pbVar4 = &local_2c0->first + (long)pgVar49;
        local_88 = (uchar)pbVar4->_M_len;
        cStack_87 = *(char *)((long)&pbVar4->_M_len + 1);
        cStack_86 = *(char *)((long)&pbVar4->_M_len + 2);
        cStack_85 = *(char *)((long)&pbVar4->_M_len + 3);
        cStack_84 = *(char *)((long)&pbVar4->_M_len + 4);
        cStack_83 = *(char *)((long)&pbVar4->_M_len + 5);
        cStack_82 = *(char *)((long)&pbVar4->_M_len + 6);
        cStack_81 = *(char *)((long)&pbVar4->_M_len + 7);
        cStack_80 = *(char *)&pbVar4->_M_str;
        uStack_7f = ((slot_type *)((long)&pbVar4->_M_str + 1))->n;
        uStack_7e = ((slot_type *)((long)&pbVar4->_M_str + 2))->n;
        uStack_7d = ((slot_type *)((long)&pbVar4->_M_str + 3))->n;
        uStack_7c = ((slot_type *)((long)&pbVar4->_M_str + 4))->n;
        uStack_7b = ((slot_type *)((long)&pbVar4->_M_str + 5))->n;
        uStack_7a = ((slot_type *)((long)&pbVar4->_M_str + 6))->n;
        uStack_79 = ((slot_type *)((long)&pbVar4->_M_str + 7))->n;
        auVar73[0] = -(local_88 == auVar89[0]);
        auVar73[1] = -(cStack_87 == auVar89[1]);
        auVar73[2] = -(cStack_86 == auVar89[2]);
        auVar73[3] = -(cStack_85 == auVar89[3]);
        auVar73[4] = -(cStack_84 == auVar89[4]);
        auVar73[5] = -(cStack_83 == auVar89[5]);
        auVar73[6] = -(cStack_82 == auVar89[6]);
        auVar73[7] = -(cStack_81 == auVar89[7]);
        auVar73[8] = -(cStack_80 == auVar89[8]);
        auVar73[9] = -(uStack_7f == auVar89[9]);
        auVar73[10] = -(uStack_7e == auVar89[10]);
        auVar73[0xb] = -(uStack_7d == auVar89[0xb]);
        auVar73[0xc] = -(uStack_7c == auVar89[0xc]);
        auVar73[0xd] = -(uStack_7b == auVar89[0xd]);
        auVar73[0xe] = -(uStack_7a == auVar89[0xe]);
        auVar73[0xf] = -(uStack_79 == auVar89[0xf]);
        local_2d0 = (pointer)CONCAT71(local_2d0._1_7_,uStack_79);
        auVar71 = auVar89;
        auVar87 = local_2a8;
        for (uVar57 = (uint)(ushort)((ushort)(SUB161(auVar73 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe);
            local_2a8 = auVar71, uVar57 != 0; uVar57 = uVar57 - 1 & uVar57) {
          uVar16 = 0;
          if (uVar57 != 0) {
            for (; (uVar57 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
            }
          }
          uVar54 = (ulong)uVar16;
          if (sVar50 == ppVar27[(long)pgVar49 * 0xf + uVar54].first._M_len) {
            local_2f8._0_8_ = ppVar27 + (long)pgVar49 * 0xf + uVar54;
            if (sVar50 == 0) goto LAB_0075f8e9;
            iVar31 = bcmp((void *)local_288._0_8_,ppVar27[(long)pgVar49 * 0xf + uVar54].first._M_str
                          ,sVar50);
            auVar89 = local_2a8;
            if (iVar31 == 0) goto LAB_0075f8e9;
          }
          auVar71 = local_2a8;
          auVar87 = local_2a8;
        }
        local_2a8 = auVar87;
        if (((char)((DefinitionSymbol *)((long)local_278 + 0x92f850))->unconnectedDrive &
            local_2d0._0_1_) == None) break;
        pSVar23 = &pSVar58->kind;
        pSVar58 = (SyntaxNode *)((long)&pSVar58->kind + 1);
        pgVar49 = (group_type_pointer)
                  ((ulong)((long)pSVar23 + (long)(pgVar49->m + 1)) & (ulong)local_2b0);
      } while (pSVar58 <= local_2b0);
      if ((this->cellOverrides).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
          .size_ctrl.size <
          (this->cellOverrides).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
          .size_ctrl.ml) {
        in_R9.values_ = (value<fmt::v11::context> *)&local_338;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                  ((locator *)&local_268._M_value,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
                    *)local_200,(arrays_type *)local_200,(size_t)local_290,(size_t)local_2d8,
                   (try_emplace_args_t *)in_R9.values_,&local_310);
        psVar2 = &(this->cellOverrides).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                  .size_ctrl.size;
        *psVar2 = *psVar2 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                  ((locator *)&local_268._M_value,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
                    *)local_200,(size_t)local_2d8,(try_emplace_args_t *)&local_338,&local_310);
      }
      local_2f8._0_8_ = local_258;
LAB_0075f8e9:
      sVar101 = parsing::Token::valueText((Token *)&((pDVar34->super_Symbol).nextInScope)->location)
      ;
      pSVar25 = local_2b8;
      lVar51 = local_2f8._0_8_;
      if (sVar101._M_len != 0) {
        local_1f0 = Compilation::getSourceLibrary(local_2c8,sVar101);
        pSVar25 = local_2b8;
        if (local_1f0 == (SourceLibrary *)0x0) {
          SVar102 = parsing::Token::range((Token *)&((pDVar34->super_Symbol).nextInScope)->location)
          ;
          pDVar36 = Scope::addDiag(pSVar25,(DiagCode)0xff0006,SVar102);
          Diagnostic::operator<<(pDVar36,sVar101);
        }
        else {
          arrays_ = (table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                     *)(lVar51 + 0x10);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_1f0;
          uVar54 = SUB168(auVar17 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar17 * ZEXT816(0x9e3779b97f4a7c15),0);
          pos0.values_ = (value<fmt::v11::context> *)(uVar54 >> (*(byte *)(lVar51 + 0x10) & 0x3f));
          plVar1 = (long *)(lVar51 + 0x20);
          uVar32 = (&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     match_word(unsigned_long)::word)[uVar54 & 0xff];
          uVar39 = 0;
          in_R9.values_ = pos0.values_;
          do {
            pcVar5 = (char *)(*plVar1 + (long)in_R9.values_ * 0x10);
            local_98 = *pcVar5;
            cStack_97 = pcVar5[1];
            cStack_96 = pcVar5[2];
            bStack_95 = pcVar5[3];
            cStack_94 = pcVar5[4];
            cStack_93 = pcVar5[5];
            cStack_92 = pcVar5[6];
            bStack_91 = pcVar5[7];
            cStack_90 = pcVar5[8];
            cStack_8f = pcVar5[9];
            cStack_8e = pcVar5[10];
            bStack_8d = pcVar5[0xb];
            cStack_8c = pcVar5[0xc];
            cStack_8b = pcVar5[0xd];
            cStack_8a = pcVar5[0xe];
            bStack_89 = pcVar5[0xf];
            cVar67 = (char)uVar32;
            auVar90[0] = -(local_98 == cVar67);
            cVar82 = (char)((uint)uVar32 >> 8);
            auVar90[1] = -(cStack_97 == cVar82);
            cVar84 = (char)((uint)uVar32 >> 0x10);
            auVar90[2] = -(cStack_96 == cVar84);
            bVar86 = (byte)((uint)uVar32 >> 0x18);
            auVar90[3] = -(bStack_95 == bVar86);
            auVar90[4] = -(cStack_94 == cVar67);
            auVar90[5] = -(cStack_93 == cVar82);
            auVar90[6] = -(cStack_92 == cVar84);
            auVar90[7] = -(bStack_91 == bVar86);
            auVar90[8] = -(cStack_90 == cVar67);
            auVar90[9] = -(cStack_8f == cVar82);
            auVar90[10] = -(cStack_8e == cVar84);
            auVar90[0xb] = -(bStack_8d == bVar86);
            auVar90[0xc] = -(cStack_8c == cVar67);
            auVar90[0xd] = -(cStack_8b == cVar82);
            auVar90[0xe] = -(cStack_8a == cVar84);
            auVar90[0xf] = -(bStack_89 == bVar86);
            uVar57 = (uint)(ushort)((ushort)(SUB161(auVar90 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar90 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar90 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar90 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar90 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar90 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar90 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar90 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar90 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar90 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar90 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar90 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar90 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar90 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar90 >> 0x77,0) & 1) << 0xe);
            if (uVar57 != 0) {
              lVar52 = *(long *)(local_2f8._0_8_ + 0x28) + (long)in_R9.values_ * 0xf0;
              do {
                iVar31 = 0;
                if (uVar57 != 0) {
                  for (; (uVar57 >> iVar31 & 1) == 0; iVar31 = iVar31 + 1) {
                  }
                }
                if (local_1f0 == *(SourceLibrary **)(lVar52 + (ulong)(uint)(iVar31 << 4))) {
                  puVar46 = *(undefined8 **)(lVar52 + (ulong)(uint)(iVar31 << 4) + 8);
                  pPVar9 = local_270->paramOverrides;
                  if ((((pPVar9 == (ParameterValueAssignmentSyntax *)0x0) || (puVar46[10] == 0)) &&
                      ((bVar30 = (local_270->liblist).
                                 super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                                 ._M_engaged, bVar30 != true || (*(char *)(puVar46 + 2) == '\0'))))
                     && ((sVar50 = (local_270->useCell).name._M_len, sVar50 == 0 ||
                         (puVar46[5] == 0)))) {
                    if (pPVar9 != (ParameterValueAssignmentSyntax *)0x0) {
                      puVar46[10] = pPVar9;
                    }
                    if (bVar30 != false) {
                      puVar46[2] = *(undefined8 *)
                                    &(local_270->liblist).
                                     super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                                     ._M_engaged;
                      sVar50 = (local_270->liblist).
                               super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                               ._M_payload._M_value._M_extent._M_extent_value;
                      *puVar46 = (local_270->liblist).
                                 super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                                 ._M_payload._M_value._M_ptr;
                      puVar46[1] = sVar50;
                      sVar50 = (local_270->useCell).name._M_len;
                    }
                    if (sVar50 != 0) {
                      *(bool *)(puVar46 + 9) = (local_270->useCell).targetConfig;
                      sVar50 = (local_270->useCell).lib._M_len;
                      pcVar5 = (local_270->useCell).lib._M_str;
                      sVar101 = (local_270->useCell).name;
                      SVar35 = (local_270->useCell).sourceRange.endLoc;
                      *(SourceLocation *)(puVar46 + 7) = (local_270->useCell).sourceRange.startLoc;
                      *(SourceLocation *)(puVar46 + 8) = SVar35;
                      *(string_view *)(puVar46 + 5) = sVar101;
                      puVar46[3] = sVar50;
                      puVar46[4] = pcVar5;
                      puVar46[0xb] = (local_270->syntax).ptr;
                    }
                  }
                  else {
                    SVar102 = slang::syntax::SyntaxNode::sourceRange((local_270->syntax).ptr);
                    pDVar36 = Scope::addDiag(pSVar25,(DiagCode)0xeb0006,SVar102);
                    local_268._M_value._M_ptr = (pointer)(local_1f0->name)._M_dataplus;
                    local_268._M_value._M_extent._M_extent_value =
                         (__extent_storage<18446744073709551615UL>)
                         (local_1f0->name)._M_string_length;
                    local_258 = (SourceLocation)local_310._M_str;
                    local_250._M_len = local_310._M_len;
                    fmt_00.size_ = 0xdd;
                    fmt_00.data_ = (char *)0xc;
                    args_00.field_1.values_ = in_R9.values_;
                    args_00.desc_ = (unsigned_long_long)&local_268;
                    ::fmt::v11::vformat_abi_cxx11_
                              (&local_338,(v11 *)"cell \'{}.{}\'",fmt_00,args_00);
                    pDVar36 = Diagnostic::operator<<(pDVar36,&local_338);
                    if ((string_view *)local_338._M_dataplus._M_p !=
                        (string_view *)&local_338.field_2) {
                      operator_delete(local_338._M_dataplus._M_p,
                                      local_338.field_2._M_allocated_capacity + 1);
                    }
                    SVar102 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)puVar46[0xb]);
                    Diagnostic::addNote(pDVar36,(DiagCode)0xa0001,SVar102);
                  }
                  goto LAB_0075f6a4;
                }
                uVar57 = uVar57 - 1 & uVar57;
                lVar51 = local_2f8._0_8_;
              } while (uVar57 != 0);
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar54 & 7] & bStack_89) == 0)
            break;
            lVar52 = uVar39 + 1;
            uVar39 = uVar39 + 1;
            in_R9.values_ =
                 (value<fmt::v11::context> *)
                 ((ulong)((long)&(in_R9.values_)->field_0 + lVar52) & *(ulong *)(lVar51 + 0x18));
          } while (uVar39 <= *(ulong *)(lVar51 + 0x18));
          if (*(ulong *)(lVar51 + 0x38) < *(ulong *)(lVar51 + 0x30)) {
            in_R9.values_ = (value<fmt::v11::context> *)&local_338;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::SourceLibrary_const*&,slang::ast::ConfigRule*&>
                      ((locator *)&local_268._M_value,arrays_,(arrays_type *)arrays_,(size_t)pos0,
                       uVar54,(try_emplace_args_t *)in_R9.values_,&local_1f0,&local_270);
            *(long *)(lVar51 + 0x38) = *(long *)(lVar51 + 0x38) + 1;
          }
          else {
            in_R9.values_ = (value<fmt::v11::context> *)&local_270;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::SourceLibrary_const*&,slang::ast::ConfigRule*&>
                      ((locator *)&local_268._M_value,arrays_,uVar54,
                       (try_emplace_args_t *)&local_338,&local_1f0,(ConfigRule **)in_R9.values_);
          }
        }
        goto LAB_0075f6a4;
      }
      pSVar59 = *(SourceLocation **)(local_2f8._0_8_ + 0x40);
      if (pSVar59 == (SourceLocation *)0x0) {
        *(ConfigRule **)(local_2f8._0_8_ + 0x40) = local_270;
        goto LAB_0075f6a4;
      }
      SVar35 = (SourceLocation)local_270->paramOverrides;
      if ((((SVar35 != (SourceLocation)0x0) && (pSVar59[10] != (SourceLocation)0x0)) ||
          ((bVar30 = (local_270->liblist).
                     super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                     ._M_engaged, bVar30 == true && (*(char *)(pSVar59 + 2) != '\0')))) ||
         ((sVar50 = (local_270->useCell).name._M_len, sVar50 != 0 &&
          (pSVar59[5] != (SourceLocation)0x0)))) {
        SVar102 = slang::syntax::SyntaxNode::sourceRange((local_270->syntax).ptr);
        pDVar36 = Scope::addDiag(pSVar25,(DiagCode)0xeb0006,SVar102);
        local_338._M_string_length = local_310._M_len;
        local_338._M_dataplus._M_p = local_310._M_str;
        fmt.size_ = 0xd;
        fmt.data_ = &DAT_00000009;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_338;
        ::fmt::v11::vformat_abi_cxx11_((string *)&local_268._M_value,(v11 *)"cell \'{}\'",fmt,args);
        pDVar36 = Diagnostic::operator<<(pDVar36,(string *)&local_268._M_value);
        if ((SourceLocation *)local_268._M_value._M_ptr != &local_258) {
          operator_delete(local_268._M_value._M_ptr,(long)local_258 + 1);
        }
        SVar102 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pSVar59[0xb]);
        Diagnostic::addNote(pDVar36,(DiagCode)0xa0001,SVar102);
        goto LAB_0075f6a4;
      }
      if (SVar35 != (SourceLocation)0x0) {
        pSVar59[10] = SVar35;
      }
      if (bVar30 != false) {
        pSVar59[2] = *(SourceLocation *)
                      &(local_270->liblist).
                       super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                       ._M_engaged;
        SVar35 = (SourceLocation)
                 (local_270->liblist).
                 super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                 ._M_payload._M_value._M_extent._M_extent_value;
        *pSVar59 = (SourceLocation)
                   (local_270->liblist).
                   super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                   ._M_payload._M_value._M_ptr;
        pSVar59[1] = SVar35;
        sVar50 = (local_270->useCell).name._M_len;
      }
      if (sVar50 == 0) goto LAB_0075f6a4;
      *(bool *)(pSVar59 + 9) = (local_270->useCell).targetConfig;
      SVar35 = (SourceLocation)(local_270->useCell).lib._M_len;
      SVar21 = (SourceLocation)(local_270->useCell).lib._M_str;
      sVar101 = (local_270->useCell).name;
      SVar22 = (local_270->useCell).sourceRange.endLoc;
      pSVar59[7] = (local_270->useCell).sourceRange.startLoc;
      pSVar59[8] = SVar22;
      *(string_view *)(pSVar59 + 5) = sVar101;
      pSVar59[3] = SVar35;
      pSVar59[4] = SVar21;
      SVar35 = (SourceLocation)(local_270->syntax).ptr;
      goto LAB_007601f1;
    }
    if (SVar8 == 0xfd) {
      this_01 = &(pDVar34->super_Symbol).nextInScope;
      local_310 = parsing::Token::valueText((Token *)this_01);
      if (local_310._M_len != 0) {
        local_278 = pDVar34;
        uVar38 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &local_190,&local_310);
        uVar54 = uVar38 >> ((byte)local_188.groups_size_index & 0x3f);
        uVar32 = (&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word)[uVar38 & 0xff];
        auVar88._4_4_ = uVar32;
        auVar88._0_4_ = uVar32;
        auVar88._8_4_ = uVar32;
        auVar88._12_4_ = uVar32;
        local_2c0 = local_188.elements_;
        sVar50 = local_310._M_len;
        local_2f8._0_8_ = local_310._M_str;
        local_300 = (value_type_pointer)(ulong)((uint)uVar38 & 7);
        local_2d8 = (group_type_pointer)local_188.groups_size_mask;
        psVar63 = (slot_type *)0x0;
        local_2d0 = (pointer)local_188.groups_;
        do {
          ppVar64 = local_2c0;
          local_2a8._0_8_ = uVar54;
          paVar3 = &local_2d0->field_0 + uVar54 * 2;
          local_58 = *(char *)paVar3;
          cStack_57 = *(char *)((long)paVar3 + 1);
          cStack_56 = *(char *)((long)paVar3 + 2);
          cStack_55 = *(char *)((long)paVar3 + 3);
          cStack_54 = *(char *)((long)paVar3 + 4);
          cStack_53 = *(char *)((long)paVar3 + 5);
          cStack_52 = *(char *)((long)paVar3 + 6);
          cStack_51 = *(char *)((long)paVar3 + 7);
          cStack_50 = *(char *)(paVar3 + 1);
          cStack_4f = *(char *)((long)paVar3 + 9);
          cStack_4e = *(char *)((long)paVar3 + 10);
          cStack_4d = *(char *)((long)paVar3 + 0xb);
          cStack_4c = *(char *)((long)paVar3 + 0xc);
          cStack_4b = *(char *)((long)paVar3 + 0xd);
          cStack_4a = *(char *)((long)paVar3 + 0xe);
          bVar86 = *(byte *)((long)paVar3 + 0xf);
          auVar72[0] = -(local_58 == auVar88[0]);
          auVar72[1] = -(cStack_57 == auVar88[1]);
          auVar72[2] = -(cStack_56 == auVar88[2]);
          auVar72[3] = -(cStack_55 == auVar88[3]);
          auVar72[4] = -(cStack_54 == auVar88[4]);
          auVar72[5] = -(cStack_53 == auVar88[5]);
          auVar72[6] = -(cStack_52 == auVar88[6]);
          auVar72[7] = -(cStack_51 == auVar88[7]);
          auVar72[8] = -(cStack_50 == auVar88[8]);
          auVar72[9] = -(cStack_4f == auVar88[9]);
          auVar72[10] = -(cStack_4e == auVar88[10]);
          auVar72[0xb] = -(cStack_4d == auVar88[0xb]);
          auVar72[0xc] = -(cStack_4c == auVar88[0xc]);
          auVar72[0xd] = -(cStack_4b == auVar88[0xd]);
          auVar72[0xe] = -(cStack_4a == auVar88[0xe]);
          auVar72[0xf] = -(bVar86 == auVar88[0xf]);
          auVar71 = auVar88;
          bStack_49 = bVar86;
          pSVar25 = local_2b8;
          auVar87 = local_288;
          for (uVar57 = (uint)(ushort)((ushort)(SUB161(auVar72 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe);
              local_288 = auVar71, local_2b8 = pSVar25, uVar57 != 0; uVar57 = uVar57 - 1 & uVar57) {
            uVar16 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
              }
            }
            if (sVar50 == ppVar64[uVar54 * 0xf + (ulong)uVar16].first._M_len) {
              if (sVar50 != 0) {
                iVar31 = bcmp((void *)local_2f8._0_8_,
                              ppVar64[uVar54 * 0xf + (ulong)uVar16].first._M_str,sVar50);
                auVar88 = local_288;
                if (iVar31 != 0) goto LAB_0075f503;
              }
              local_2d8 = (group_type_pointer)
                          hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                          operator()(local_1f8,&local_310);
              pgVar49 = (group_type_pointer)
                        ((ulong)local_2d8 >>
                        ((byte)(this->instanceOverrides).table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                               .arrays.groups_size_index & 0x3f));
              local_2d0 = (pointer)(this->instanceOverrides).table_.
                                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                   .arrays.groups_;
              uVar32 = (&boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         match_word(unsigned_long)::word)[(ulong)local_2d8 & 0xff];
              auVar91._4_4_ = uVar32;
              auVar91._0_4_ = uVar32;
              auVar91._8_4_ = uVar32;
              auVar91._12_4_ = uVar32;
              local_300 = (this->instanceOverrides).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                          .arrays.elements_;
              sVar50 = local_310._M_len;
              local_288._0_8_ = local_310._M_str;
              local_2c0 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                           *)(ulong)((uint)local_2d8 & 7);
              local_2b0 = (SyntaxNode *)
                          (this->instanceOverrides).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                          .arrays.groups_size_mask;
              pSVar58 = (SyntaxNode *)0x0;
              local_290 = pgVar49;
              goto LAB_0075fd44;
            }
LAB_0075f503:
            auVar71 = local_288;
            pSVar25 = local_2b8;
            auVar87 = local_288;
          }
          local_288 = auVar87;
          if ((*(byte *)&(((flat_hash_map<const_SourceLibrary_*,_ConfigRule_*> *)
                          &(((value_type_pointer)((long)local_300 + 0x92f880))->second).childNodes)
                         ->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                         .arrays.groups_ & bVar86) == 0) break;
          psVar48 = ((group_type_pointer)psVar63)->m;
          psVar63 = ((group_type_pointer)psVar63)->m + 1;
          uVar54 = (ulong)(psVar48 + local_2a8._0_8_ + 1) & (ulong)local_2d8;
        } while (psVar63 <= local_2d8);
        SVar102 = parsing::Token::range((Token *)this_01);
        Scope::addDiag(pSVar25,(DiagCode)0x1b0006,SVar102);
      }
    }
    else {
      sVar100 = resolve::anon_class_16_2_f7902cf0::operator()
                          (&local_1e8,
                           (ConfigLiblistSyntax *)(pDVar34->super_Symbol).nextInScope[1].name._M_str
                          );
      (this->defaultLiblist)._M_ptr = sVar100._M_ptr;
      (this->defaultLiblist)._M_extent =
           (__extent_storage<18446744073709551615UL>)sVar100._M_extent._M_extent_value;
    }
    goto LAB_0075f6a4;
  }
LAB_0075ee5b:
  local_2d0 = (pointer)&this->instanceOverrides;
  iVar97 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
           ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                    *)local_2d0);
  ppVar44 = iVar97.p_;
  if (ppVar44 != (table_element_pointer)0x0) {
LAB_007605b7:
    do {
      ppVar44 = iVar97.p_;
      if ((ppVar44->second).rule != (ConfigRule *)0x0) {
        uVar38 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &local_190,&ppVar44->first);
        ptVar45 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                   *)(uVar38 >> ((byte)local_188.groups_size_index & 0x3f));
        uVar32 = (&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word)[uVar38 & 0xff];
        auVar93._4_4_ = uVar32;
        auVar93._0_4_ = uVar32;
        auVar93._8_4_ = uVar32;
        auVar93._12_4_ = uVar32;
        psVar63 = (slot_type *)0x0;
        do {
          ppVar29 = local_188.elements_;
          paVar3 = (anon_union_8_3_62382250_for_ParameterDecl_0 *)(local_188.groups_)->m +
                   (long)ptVar45 * 2;
          local_a8 = *(char *)paVar3;
          cStack_a7 = *(char *)((long)paVar3 + 1);
          cStack_a6 = *(char *)((long)paVar3 + 2);
          cStack_a5 = *(char *)((long)paVar3 + 3);
          cStack_a4 = *(char *)((long)paVar3 + 4);
          cStack_a3 = *(char *)((long)paVar3 + 5);
          cStack_a2 = *(char *)((long)paVar3 + 6);
          cStack_a1 = *(char *)((long)paVar3 + 7);
          cStack_a0 = *(char *)(paVar3 + 1);
          cStack_9f = *(char *)((long)paVar3 + 9);
          cStack_9e = *(char *)((long)paVar3 + 10);
          cStack_9d = *(char *)((long)paVar3 + 0xb);
          cStack_9c = *(char *)((long)paVar3 + 0xc);
          cStack_9b = *(char *)((long)paVar3 + 0xd);
          cStack_9a = *(char *)((long)paVar3 + 0xe);
          bVar86 = *(byte *)((long)paVar3 + 0xf);
          auVar78[0] = -(local_a8 == auVar93[0]);
          auVar78[1] = -(cStack_a7 == auVar93[1]);
          auVar78[2] = -(cStack_a6 == auVar93[2]);
          auVar78[3] = -(cStack_a5 == auVar93[3]);
          auVar78[4] = -(cStack_a4 == auVar93[4]);
          auVar78[5] = -(cStack_a3 == auVar93[5]);
          auVar78[6] = -(cStack_a2 == auVar93[6]);
          auVar78[7] = -(cStack_a1 == auVar93[7]);
          auVar78[8] = -(cStack_a0 == auVar93[8]);
          auVar78[9] = -(cStack_9f == auVar93[9]);
          auVar78[10] = -(cStack_9e == auVar93[10]);
          auVar78[0xb] = -(cStack_9d == auVar93[0xb]);
          auVar78[0xc] = -(cStack_9c == auVar93[0xc]);
          auVar78[0xd] = -(cStack_9b == auVar93[0xd]);
          auVar78[0xe] = -(cStack_9a == auVar93[0xe]);
          auVar78[0xf] = -(bVar86 == auVar93[0xf]);
          uVar57 = (uint)(ushort)((ushort)(SUB161(auVar78 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar78 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar78 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar78 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar78 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar78 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar78 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar78 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar78 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar78 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar78 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar78 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar78 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar78 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar78 >> 0x77,0) & 1) << 0xe);
          bStack_99 = bVar86;
          if (uVar57 != 0) {
            local_288._0_8_ = psVar63;
            local_2a8._0_8_ =
                 (anon_union_8_3_62382250_for_ParameterDecl_0 *)(local_188.groups_)->m +
                 (long)ptVar45 * 2;
            local_2f8 = auVar93;
            local_2e8 = ptVar45;
            do {
              local_2e0 = (Token *)(ulong)uVar57;
              uVar16 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              ppVar64 = ppVar29 + (long)ptVar45 * 0xf + (ulong)uVar16;
              bVar30 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)&local_190,&ppVar44->first,&ppVar64->first);
              if (bVar30) goto LAB_0076078d;
              uVar57 = (uint)local_2e0 - 1 & (uint)local_2e0;
            } while (uVar57 != 0);
            bVar86 = *(byte *)(local_2a8._0_8_ + 0xf);
            ptVar45 = local_2e8;
            psVar63 = (slot_type *)local_288._0_8_;
            auVar93 = local_2f8;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar38 & 7] & bVar86) == 0) break;
          psVar48 = ((group_type_pointer)psVar63)->m;
          psVar63 = ((group_type_pointer)psVar63)->m + 1;
          ptVar45 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                     *)((ulong)(psVar48 + (long)(ptVar45 + 1)) & local_188.groups_size_mask);
        } while (psVar63 <= local_188.groups_size_mask);
        ppVar64 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                   *)0x0;
LAB_0076078d:
        pSVar25 = local_2b8;
        pCVar37 = (ppVar44->second).rule;
        if ((pCVar37->useCell).name._M_len != 0) {
          SVar102 = slang::syntax::SyntaxNode::sourceRange((pCVar37->syntax).ptr);
          Scope::addDiag(pSVar25,(DiagCode)0x1c0006,SVar102);
          pCVar37 = (ppVar44->second).rule;
        }
        local_130.data_[ppVar64->second].rule = pCVar37;
      }
      puVar41 = iVar97.pc_ + 0x12;
      puVar62 = iVar97.pc_ + 2;
LAB_007605ce:
      puVar33 = puVar62;
      puVar62 = iVar97.pc_;
      ppVar60 = iVar97.p_ + 1;
      if (((uint)iVar97.pc_ & 0xf) != 0xe) goto code_r0x007605dd;
      auVar76[0] = -(*puVar33 == '\0');
      auVar76[1] = -(puVar33[1] == '\0');
      auVar76[2] = -(puVar33[2] == '\0');
      auVar76[3] = -(puVar33[3] == '\0');
      auVar76[4] = -(puVar33[4] == '\0');
      auVar76[5] = -(puVar33[5] == '\0');
      auVar76[6] = -(puVar33[6] == '\0');
      auVar76[7] = -(puVar33[7] == '\0');
      auVar76[8] = -(puVar33[8] == '\0');
      auVar76[9] = -(puVar33[9] == '\0');
      auVar76[10] = -(puVar33[10] == '\0');
      auVar76[0xb] = -(puVar33[0xb] == '\0');
      auVar76[0xc] = -(puVar33[0xc] == '\0');
      auVar76[0xd] = -(puVar33[0xd] == '\0');
      auVar76[0xe] = -(puVar33[0xe] == '\0');
      auVar76[0xf] = -(puVar33[0xf] == '\0');
      uVar20 = (ushort)(SUB161(auVar76 >> 7,0) & 1) | (ushort)(SUB161(auVar76 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar76 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar76 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar76 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar76 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar76 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar76 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar76 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar76 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar76 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar76 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar76 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar76 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar76 >> 0x77,0) & 1) << 0xe;
      while (uVar57 = (uint)uVar20, uVar57 == 0x7fff) {
        ppVar60 = ppVar60 + 0xf;
        auVar77[0] = -(*puVar41 == '\0');
        auVar77[1] = -(puVar41[1] == '\0');
        auVar77[2] = -(puVar41[2] == '\0');
        auVar77[3] = -(puVar41[3] == '\0');
        auVar77[4] = -(puVar41[4] == '\0');
        auVar77[5] = -(puVar41[5] == '\0');
        auVar77[6] = -(puVar41[6] == '\0');
        auVar77[7] = -(puVar41[7] == '\0');
        auVar77[8] = -(puVar41[8] == '\0');
        auVar77[9] = -(puVar41[9] == '\0');
        auVar77[10] = -(puVar41[10] == '\0');
        auVar77[0xb] = -(puVar41[0xb] == '\0');
        auVar77[0xc] = -(puVar41[0xc] == '\0');
        auVar77[0xd] = -(puVar41[0xd] == '\0');
        auVar77[0xe] = -(puVar41[0xe] == '\0');
        auVar77[0xf] = -(puVar41[0xf] == '\0');
        puVar33 = puVar41;
        puVar41 = puVar41 + 0x10;
        uVar20 = (ushort)(SUB161(auVar77 >> 7,0) & 1) | (ushort)(SUB161(auVar77 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar77 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar77 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar77 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar77 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar77 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar77 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar77 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar77 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar77 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar77 >> 0x77,0) & 1) << 0xe;
      }
      ppVar44 = (table_element_pointer)(ulong)uVar57;
      uVar16 = 0;
      if ((uVar57 ^ 0x7fff) != 0) {
        for (; ((uVar57 ^ 0x7fff) >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
        }
      }
      if (puVar33[uVar16] == '\x01') break;
      iVar97.p_ = ppVar60 + uVar16;
      iVar97.pc_ = puVar33 + uVar16;
    } while( true );
  }
LAB_0075ee78:
  if ((Compilation *)local_130.len != (Compilation *)0x0) {
    pTVar61 = local_130.data_ + local_130.len;
    local_2e0 = (Token *)&this->cellOverrides;
    pTVar65 = local_130.data_;
    do {
      pTVar56 = local_2e0;
      if (pTVar65->rule == (ConfigRule *)0x0) {
        local_2e8 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                     *)&pTVar65->rule;
        ppVar44 = (table_element_pointer)&(pTVar65->definition->super_Symbol).name;
        uVar38 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            local_2e0,(basic_string_view<char,_std::char_traits<char>_> *)ppVar44);
        uVar54 = uVar38 >> ((char)pTVar56->kind & PercentEqual);
        uVar32 = (&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word)[uVar38 & 0xff];
        auVar94._4_4_ = uVar32;
        auVar94._0_4_ = uVar32;
        auVar94._8_4_ = uVar32;
        auVar94._12_4_ = uVar32;
        uVar39 = 0;
        do {
          pgVar13 = (this->cellOverrides).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                    .arrays.groups_;
          pgVar6 = pgVar13 + uVar54;
          local_b8 = pgVar6->m[0].n;
          uStack_b7 = pgVar6->m[1].n;
          uStack_b6 = pgVar6->m[2].n;
          uStack_b5 = pgVar6->m[3].n;
          uStack_b4 = pgVar6->m[4].n;
          uStack_b3 = pgVar6->m[5].n;
          uStack_b2 = pgVar6->m[6].n;
          uStack_b1 = pgVar6->m[7].n;
          uStack_b0 = pgVar6->m[8].n;
          uStack_af = pgVar6->m[9].n;
          uStack_ae = pgVar6->m[10].n;
          uStack_ad = pgVar6->m[0xb].n;
          uStack_ac = pgVar6->m[0xc].n;
          uStack_ab = pgVar6->m[0xd].n;
          uStack_aa = pgVar6->m[0xe].n;
          bVar86 = pgVar6->m[0xf].n;
          auVar79[0] = -(local_b8 == auVar94[0]);
          auVar79[1] = -(uStack_b7 == auVar94[1]);
          auVar79[2] = -(uStack_b6 == auVar94[2]);
          auVar79[3] = -(uStack_b5 == auVar94[3]);
          auVar79[4] = -(uStack_b4 == auVar94[4]);
          auVar79[5] = -(uStack_b3 == auVar94[5]);
          auVar79[6] = -(uStack_b2 == auVar94[6]);
          auVar79[7] = -(uStack_b1 == auVar94[7]);
          auVar79[8] = -(uStack_b0 == auVar94[8]);
          auVar79[9] = -(uStack_af == auVar94[9]);
          auVar79[10] = -(uStack_ae == auVar94[10]);
          auVar79[0xb] = -(uStack_ad == auVar94[0xb]);
          auVar79[0xc] = -(uStack_ac == auVar94[0xc]);
          auVar79[0xd] = -(uStack_ab == auVar94[0xd]);
          auVar79[0xe] = -(uStack_aa == auVar94[0xe]);
          auVar79[0xf] = -(bVar86 == auVar94[0xf]);
          uVar57 = (uint)(ushort)((ushort)(SUB161(auVar79 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar79 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar79 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar79 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar79 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar79 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar79 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar79 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar79 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar79 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar79 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar79 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar79 >> 0x77,0) & 1) << 0xe);
          bStack_a9 = bVar86;
          if (uVar57 != 0) {
            local_300 = (value_type_pointer)(pgVar13 + uVar54);
            ppVar14 = (this->cellOverrides).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                      .arrays.elements_;
            local_288._0_8_ = uVar54;
            local_2a8 = auVar94;
            do {
              auVar87 = local_2f8;
              local_2f8._4_4_ = 0;
              local_2f8._0_4_ = uVar57;
              local_2f8._8_8_ = auVar87._8_8_;
              uVar16 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              bVar30 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)local_2e0,
                                  (basic_string_view<char,_std::char_traits<char>_> *)ppVar44,
                                  &ppVar14[uVar54 * 0xf + (ulong)uVar16].first);
              if (bVar30) {
                resolve();
                pSVar25 = local_2b8;
                ppVar44 = extraout_RDX_00;
                if ((extraout_RAX & 1) == 0) {
                  SVar102 = slang::syntax::SyntaxNode::sourceRange
                                      ((SyntaxNode *)local_268._M_value._M_ptr[0xb]);
                  Scope::addDiag(pSVar25,(DiagCode)0x1c0006,SVar102);
                  ppVar44 = extraout_RDX_01;
                }
                goto LAB_0076080a;
              }
              uVar57 = local_2f8._0_4_ - 1 & local_2f8._0_4_;
            } while (uVar57 != 0);
            bVar86 = *(byte *)((long)&(local_300->first)._M_str + 7);
            uVar54 = local_288._0_8_;
            auVar94 = local_2a8;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar38 & 7] & bVar86) == 0) break;
          uVar53 = (this->cellOverrides).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                   .arrays.groups_size_mask;
          lVar51 = uVar54 + uVar39;
          uVar39 = uVar39 + 1;
          uVar54 = lVar51 + 1U & uVar53;
        } while (uVar39 <= uVar53);
      }
LAB_0076080a:
      pTVar65 = pTVar65 + 1;
    } while (pTVar65 != pTVar61);
  }
  iVar31 = SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::copy
                     (&local_130,(EVP_PKEY_CTX *)local_2c8,(EVP_PKEY_CTX *)ppVar44);
  (this->topCells)._M_ptr = (pointer)CONCAT44(extraout_var,iVar31);
  (this->topCells)._M_extent._M_extent_value = extraout_RDX;
  iVar98 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
           ::begin(&(this->cellOverrides).table_);
  if (iVar98.p_ != (table_element_pointer)0x0) {
    local_2e8 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                 *)&this->ruleBySyntax;
    do {
      local_2c8 = (Compilation *)iVar98.p_;
      lVar51 = *(long *)&(local_2c8->options).typoCorrectionLimit;
      if (lVar51 != 0) {
        uVar54 = *(ulong *)(lVar51 + 0x58);
        local_338._M_dataplus._M_p = (pointer)uVar54;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uVar54;
        hash = SUB168(auVar18 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar18 * ZEXT816(0x9e3779b97f4a7c15),0);
        pos0_00 = hash >> ((byte)(this->ruleBySyntax).table_.
                                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                 .arrays.groups_size_index & 0x3f);
        uVar32 = (&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word)[hash & 0xff];
        ppVar15 = (this->ruleBySyntax).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                  .arrays.elements_;
        uVar39 = (this->ruleBySyntax).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                 .arrays.groups_size_mask;
        uVar55 = 0;
        uVar53 = pos0_00;
        do {
          pgVar7 = (this->ruleBySyntax).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                   .arrays.groups_ + uVar53;
          local_c8 = pgVar7->m[0].n;
          uStack_c7 = pgVar7->m[1].n;
          uStack_c6 = pgVar7->m[2].n;
          bStack_c5 = pgVar7->m[3].n;
          uStack_c4 = pgVar7->m[4].n;
          uStack_c3 = pgVar7->m[5].n;
          uStack_c2 = pgVar7->m[6].n;
          bStack_c1 = pgVar7->m[7].n;
          uStack_c0 = pgVar7->m[8].n;
          uStack_bf = pgVar7->m[9].n;
          uStack_be = pgVar7->m[10].n;
          bStack_bd = pgVar7->m[0xb].n;
          uStack_bc = pgVar7->m[0xc].n;
          uStack_bb = pgVar7->m[0xd].n;
          uStack_ba = pgVar7->m[0xe].n;
          bStack_b9 = pgVar7->m[0xf].n;
          uVar68 = (uchar)uVar32;
          auVar95[0] = -(local_c8 == uVar68);
          uVar83 = (uchar)((uint)uVar32 >> 8);
          auVar95[1] = -(uStack_c7 == uVar83);
          uVar85 = (uchar)((uint)uVar32 >> 0x10);
          auVar95[2] = -(uStack_c6 == uVar85);
          bVar86 = (byte)((uint)uVar32 >> 0x18);
          auVar95[3] = -(bStack_c5 == bVar86);
          auVar95[4] = -(uStack_c4 == uVar68);
          auVar95[5] = -(uStack_c3 == uVar83);
          auVar95[6] = -(uStack_c2 == uVar85);
          auVar95[7] = -(bStack_c1 == bVar86);
          auVar95[8] = -(uStack_c0 == uVar68);
          auVar95[9] = -(uStack_bf == uVar83);
          auVar95[10] = -(uStack_be == uVar85);
          auVar95[0xb] = -(bStack_bd == bVar86);
          auVar95[0xc] = -(uStack_bc == uVar68);
          auVar95[0xd] = -(uStack_bb == uVar83);
          auVar95[0xe] = -(uStack_ba == uVar85);
          auVar95[0xf] = -(bStack_b9 == bVar86);
          for (uVar57 = (uint)(ushort)((ushort)(SUB161(auVar95 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar95 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar95 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar95 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar95 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar95 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar95 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar95 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar95 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar95 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar95 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar95 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar95 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar95 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar95 >> 0x77,0) & 1) << 0xe); uVar57 != 0;
              uVar57 = uVar57 - 1 & uVar57) {
            iVar31 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> iVar31 & 1) == 0; iVar31 = iVar31 + 1) {
              }
            }
            if (uVar54 == *(ulong *)((long)&ppVar15[uVar53 * 0xf].first + (ulong)(uint)(iVar31 << 4)
                                    )) {
              SVar35 = (SourceLocation)
                       ((long)&ppVar15[uVar53 * 0xf].first + (ulong)(uint)(iVar31 << 4));
              goto LAB_00760b11;
            }
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_b9) == 0) break;
          lVar52 = uVar53 + uVar55;
          uVar55 = uVar55 + 1;
          uVar53 = lVar52 + 1U & uVar39;
        } while (uVar55 <= uVar39);
        if ((this->ruleBySyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
            .size_ctrl.size <
            (this->ruleBySyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                    ((locator *)&local_268._M_value,local_2e8,(arrays_type *)local_2e8,pos0_00,hash,
                     (try_emplace_args_t *)&local_310,(SyntaxNode **)&local_338);
          psVar2 = &(this->ruleBySyntax).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                    .size_ctrl.size;
          *psVar2 = *psVar2 + 1;
          SVar35 = local_258;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                    ((locator *)&local_268._M_value,local_2e8,hash,(try_emplace_args_t *)&local_310,
                     (SyntaxNode **)&local_338);
          SVar35 = local_258;
        }
LAB_00760b11:
        *(long *)((long)SVar35 + 8) = lVar51;
      }
      local_2f8._0_8_ = iVar98.pc_;
      iVar103 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                ::begin((table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                         *)&local_2c8->options);
      if (iVar103.p_ != (table_element_pointer)0x0) {
LAB_00760b6f:
        do {
          pCVar37 = (iVar103.p_)->second;
          pSVar58 = (pCVar37->syntax).ptr;
          local_338._M_dataplus._M_p = (pointer)pSVar58;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = pSVar58;
          uVar53 = SUB168(auVar19 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar19 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar39 = uVar53 >> ((byte)(this->ruleBySyntax).table_.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                    .arrays.groups_size_index & 0x3f);
          uVar32 = (&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     match_word(unsigned_long)::word)[uVar53 & 0xff];
          ppVar15 = (this->ruleBySyntax).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                    .arrays.elements_;
          local_2e0 = (Token *)(this->ruleBySyntax).table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                               .arrays.groups_size_mask;
          pTVar56 = (Token *)0x0;
          uVar54 = uVar39;
          do {
            pgVar7 = (this->ruleBySyntax).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                     .arrays.groups_ + uVar54;
            local_d8 = pgVar7->m[0].n;
            uStack_d7 = pgVar7->m[1].n;
            uStack_d6 = pgVar7->m[2].n;
            bStack_d5 = pgVar7->m[3].n;
            uStack_d4 = pgVar7->m[4].n;
            uStack_d3 = pgVar7->m[5].n;
            uStack_d2 = pgVar7->m[6].n;
            bStack_d1 = pgVar7->m[7].n;
            uStack_d0 = pgVar7->m[8].n;
            uStack_cf = pgVar7->m[9].n;
            uStack_ce = pgVar7->m[10].n;
            bStack_cd = pgVar7->m[0xb].n;
            uStack_cc = pgVar7->m[0xc].n;
            uStack_cb = pgVar7->m[0xd].n;
            uStack_ca = pgVar7->m[0xe].n;
            bStack_c9 = pgVar7->m[0xf].n;
            uVar68 = (uchar)uVar32;
            auVar96[0] = -(local_d8 == uVar68);
            uVar83 = (uchar)((uint)uVar32 >> 8);
            auVar96[1] = -(uStack_d7 == uVar83);
            uVar85 = (uchar)((uint)uVar32 >> 0x10);
            auVar96[2] = -(uStack_d6 == uVar85);
            bVar86 = (byte)((uint)uVar32 >> 0x18);
            auVar96[3] = -(bStack_d5 == bVar86);
            auVar96[4] = -(uStack_d4 == uVar68);
            auVar96[5] = -(uStack_d3 == uVar83);
            auVar96[6] = -(uStack_d2 == uVar85);
            auVar96[7] = -(bStack_d1 == bVar86);
            auVar96[8] = -(uStack_d0 == uVar68);
            auVar96[9] = -(uStack_cf == uVar83);
            auVar96[10] = -(uStack_ce == uVar85);
            auVar96[0xb] = -(bStack_cd == bVar86);
            auVar96[0xc] = -(uStack_cc == uVar68);
            auVar96[0xd] = -(uStack_cb == uVar83);
            auVar96[0xe] = -(uStack_ca == uVar85);
            auVar96[0xf] = -(bStack_c9 == bVar86);
            for (uVar57 = (uint)(ushort)((ushort)(SUB161(auVar96 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar96 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar96 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar96 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar96 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar96 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar96 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar96 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar96 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar96 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar96 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar96 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar96 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar96 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar96 >> 0x77,0) & 1) << 0xe); uVar57 != 0
                ; uVar57 = uVar57 - 1 & uVar57) {
              iVar31 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> iVar31 & 1) == 0; iVar31 = iVar31 + 1) {
                }
              }
              if (pSVar58 ==
                  *(SyntaxNode **)((long)&ppVar15[uVar54 * 0xf].first + (ulong)(uint)(iVar31 << 4)))
              {
                SVar35 = (SourceLocation)
                         ((long)&ppVar15[uVar54 * 0xf].first + (ulong)(uint)(iVar31 << 4));
                goto LAB_00760cbb;
              }
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar53 & 7] & bStack_c9) == 0)
            break;
            pTVar24 = &pTVar56->kind;
            pTVar56 = (Token *)((long)&pTVar56->kind + 1);
            uVar54 = (ulong)((long)pTVar24 + uVar54 + 1) & (ulong)local_2e0;
          } while (pTVar56 <= local_2e0);
          if ((this->ruleBySyntax).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
              .size_ctrl.size <
              (this->ruleBySyntax).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
              .size_ctrl.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                      ((locator *)&local_268._M_value,local_2e8,(arrays_type *)local_2e8,uVar39,
                       uVar53,(try_emplace_args_t *)&local_310,(SyntaxNode **)&local_338);
            psVar2 = &(this->ruleBySyntax).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                      .size_ctrl.size;
            *psVar2 = *psVar2 + 1;
            SVar35 = local_258;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                      ((locator *)&local_268._M_value,local_2e8,uVar53,
                       (try_emplace_args_t *)&local_310,(SyntaxNode **)&local_338);
            SVar35 = local_258;
          }
LAB_00760cbb:
          *(ConfigRule **)((long)SVar35 + 8) = pCVar37;
          puVar43 = iVar103.pc_ + 0x12;
          puVar47 = iVar103.pc_ + 2;
LAB_00760cca:
          puVar40 = puVar47;
          puVar47 = iVar103.pc_;
          ppVar66 = iVar103.p_ + 1;
          if (((uint)iVar103.pc_ & 0xf) != 0xe) goto code_r0x00760cd8;
          auVar80[0] = -(*puVar40 == '\0');
          auVar80[1] = -(puVar40[1] == '\0');
          auVar80[2] = -(puVar40[2] == '\0');
          auVar80[3] = -(puVar40[3] == '\0');
          auVar80[4] = -(puVar40[4] == '\0');
          auVar80[5] = -(puVar40[5] == '\0');
          auVar80[6] = -(puVar40[6] == '\0');
          auVar80[7] = -(puVar40[7] == '\0');
          auVar80[8] = -(puVar40[8] == '\0');
          auVar80[9] = -(puVar40[9] == '\0');
          auVar80[10] = -(puVar40[10] == '\0');
          auVar80[0xb] = -(puVar40[0xb] == '\0');
          auVar80[0xc] = -(puVar40[0xc] == '\0');
          auVar80[0xd] = -(puVar40[0xd] == '\0');
          auVar80[0xe] = -(puVar40[0xe] == '\0');
          auVar80[0xf] = -(puVar40[0xf] == '\0');
          uVar20 = (ushort)(SUB161(auVar80 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar80 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar80 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar80 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar80 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar80 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar80 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar80 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar80 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar80 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar80 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar80 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar80 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar80 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar80 >> 0x77,0) & 1) << 0xe;
          while (uVar20 == 0x7fff) {
            ppVar66 = ppVar66 + 0xf;
            auVar81[0] = -(*puVar43 == '\0');
            auVar81[1] = -(puVar43[1] == '\0');
            auVar81[2] = -(puVar43[2] == '\0');
            auVar81[3] = -(puVar43[3] == '\0');
            auVar81[4] = -(puVar43[4] == '\0');
            auVar81[5] = -(puVar43[5] == '\0');
            auVar81[6] = -(puVar43[6] == '\0');
            auVar81[7] = -(puVar43[7] == '\0');
            auVar81[8] = -(puVar43[8] == '\0');
            auVar81[9] = -(puVar43[9] == '\0');
            auVar81[10] = -(puVar43[10] == '\0');
            auVar81[0xb] = -(puVar43[0xb] == '\0');
            auVar81[0xc] = -(puVar43[0xc] == '\0');
            auVar81[0xd] = -(puVar43[0xd] == '\0');
            auVar81[0xe] = -(puVar43[0xe] == '\0');
            auVar81[0xf] = -(puVar43[0xf] == '\0');
            puVar40 = puVar43;
            puVar43 = puVar43 + 0x10;
            uVar20 = (ushort)(SUB161(auVar81 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar81 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar81 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar81 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar81 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar81 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar81 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar81 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar81 >> 0x77,0) & 1) << 0xe;
          }
          uVar57 = 0;
          if ((uVar20 ^ 0x7fff) != 0) {
            for (; ((uVar20 ^ 0x7fff) >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
            }
          }
          if (puVar40[uVar57] == '\x01') break;
          iVar103.p_ = (table_element_pointer)((long)&ppVar66->first + (ulong)(uVar57 << 4));
          iVar103.pc_ = puVar40 + uVar57;
        } while( true );
      }
LAB_00760b30:
      resolve();
      iVar98.p_ = (table_element_pointer)local_268._M_value._M_ptr;
      iVar98.pc_ = (char_pointer)local_338._M_dataplus._M_p;
    } while ((extraout_RAX_00 & 1) == 0);
  }
  if (this->resolved == false) {
    resolve(this);
  }
  iVar99 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
           ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                    *)local_2d0);
  if (iVar99.p_ != (table_element_pointer)0x0) {
LAB_0075eef3:
    do {
      registerRules(this,&(iVar99.p_)->second);
      puVar41 = iVar99.pc_ + 0x12;
      puVar62 = iVar99.pc_ + 2;
      while( true ) {
        puVar33 = puVar62;
        puVar62 = iVar99.pc_;
        ppVar44 = iVar99.p_ + 1;
        if (((uint)iVar99.pc_ & 0xf) == 0xe) break;
        iVar99.p_ = ppVar44;
        iVar99.pc_ = puVar62 + 1;
        puVar41 = puVar41 + 1;
        puVar62 = puVar33 + 1;
        if (puVar33[-1] != '\0') goto code_r0x0075ef2e;
      }
      auVar69[0] = -(*puVar33 == '\0');
      auVar69[1] = -(puVar33[1] == '\0');
      auVar69[2] = -(puVar33[2] == '\0');
      auVar69[3] = -(puVar33[3] == '\0');
      auVar69[4] = -(puVar33[4] == '\0');
      auVar69[5] = -(puVar33[5] == '\0');
      auVar69[6] = -(puVar33[6] == '\0');
      auVar69[7] = -(puVar33[7] == '\0');
      auVar69[8] = -(puVar33[8] == '\0');
      auVar69[9] = -(puVar33[9] == '\0');
      auVar69[10] = -(puVar33[10] == '\0');
      auVar69[0xb] = -(puVar33[0xb] == '\0');
      auVar69[0xc] = -(puVar33[0xc] == '\0');
      auVar69[0xd] = -(puVar33[0xd] == '\0');
      auVar69[0xe] = -(puVar33[0xe] == '\0');
      auVar69[0xf] = -(puVar33[0xf] == '\0');
      uVar20 = (ushort)(SUB161(auVar69 >> 7,0) & 1) | (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe;
      while (uVar20 == 0x7fff) {
        ppVar44 = ppVar44 + 0xf;
        auVar70[0] = -(*puVar41 == '\0');
        auVar70[1] = -(puVar41[1] == '\0');
        auVar70[2] = -(puVar41[2] == '\0');
        auVar70[3] = -(puVar41[3] == '\0');
        auVar70[4] = -(puVar41[4] == '\0');
        auVar70[5] = -(puVar41[5] == '\0');
        auVar70[6] = -(puVar41[6] == '\0');
        auVar70[7] = -(puVar41[7] == '\0');
        auVar70[8] = -(puVar41[8] == '\0');
        auVar70[9] = -(puVar41[9] == '\0');
        auVar70[10] = -(puVar41[10] == '\0');
        auVar70[0xb] = -(puVar41[0xb] == '\0');
        auVar70[0xc] = -(puVar41[0xc] == '\0');
        auVar70[0xd] = -(puVar41[0xd] == '\0');
        auVar70[0xe] = -(puVar41[0xe] == '\0');
        auVar70[0xf] = -(puVar41[0xf] == '\0');
        puVar33 = puVar41;
        puVar41 = puVar41 + 0x10;
        uVar20 = (ushort)(SUB161(auVar70 >> 7,0) & 1) | (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe;
      }
      uVar57 = 0;
      if ((uVar20 ^ 0x7fff) != 0) {
        for (; ((uVar20 ^ 0x7fff) >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
        }
      }
      if (puVar33[uVar57] == '\x01') break;
      iVar99.p_ = ppVar44 + uVar57;
      iVar99.pc_ = puVar33 + uVar57;
    } while( true );
  }
LAB_0075ef97:
  if (local_130.data_ != (pointer)local_130.firstElement) {
    operator_delete(local_130.data_);
  }
  local_268._M_value._M_ptr = (pointer)local_190;
  if (local_188.elements_ !=
      (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *)0x0) {
    slang::detail::hashing::
    StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>
    ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>
                  *)&local_268._M_value,local_188.elements_,
                 (local_188.groups_size_mask * 0x178 + 0x186) / 0x18);
  }
  return;
  while( true ) {
    pSVar23 = &pSVar58->kind;
    pSVar58 = (SyntaxNode *)((long)&pSVar58->kind + 1);
    pgVar49 = (group_type_pointer)
              ((ulong)((long)pSVar23 + (long)(pgVar49->m + 1)) & (ulong)local_2b0);
    if (local_2b0 < pSVar58) break;
LAB_0075fd44:
    ppVar27 = local_300;
    paVar3 = &local_2d0->field_0 + (long)pgVar49 * 2;
    local_68 = *(char *)paVar3;
    cStack_67 = *(char *)((long)paVar3 + 1);
    cStack_66 = *(char *)((long)paVar3 + 2);
    cStack_65 = *(char *)((long)paVar3 + 3);
    cStack_64 = *(char *)((long)paVar3 + 4);
    cStack_63 = *(char *)((long)paVar3 + 5);
    cStack_62 = *(char *)((long)paVar3 + 6);
    cStack_61 = *(char *)((long)paVar3 + 7);
    cStack_60 = *(char *)(paVar3 + 1);
    cStack_5f = *(char *)((long)paVar3 + 9);
    cStack_5e = *(char *)((long)paVar3 + 10);
    cStack_5d = *(char *)((long)paVar3 + 0xb);
    cStack_5c = *(char *)((long)paVar3 + 0xc);
    cStack_5b = *(char *)((long)paVar3 + 0xd);
    cStack_5a = *(char *)((long)paVar3 + 0xe);
    bVar86 = *(byte *)((long)paVar3 + 0xf);
    auVar74[0] = -(local_68 == auVar91[0]);
    auVar74[1] = -(cStack_67 == auVar91[1]);
    auVar74[2] = -(cStack_66 == auVar91[2]);
    auVar74[3] = -(cStack_65 == auVar91[3]);
    auVar74[4] = -(cStack_64 == auVar91[4]);
    auVar74[5] = -(cStack_63 == auVar91[5]);
    auVar74[6] = -(cStack_62 == auVar91[6]);
    auVar74[7] = -(cStack_61 == auVar91[7]);
    auVar74[8] = -(cStack_60 == auVar91[8]);
    auVar74[9] = -(cStack_5f == auVar91[9]);
    auVar74[10] = -(cStack_5e == auVar91[10]);
    auVar74[0xb] = -(cStack_5d == auVar91[0xb]);
    auVar74[0xc] = -(cStack_5c == auVar91[0xc]);
    auVar74[0xd] = -(cStack_5b == auVar91[0xd]);
    auVar74[0xe] = -(cStack_5a == auVar91[0xe]);
    auVar74[0xf] = -(bVar86 == auVar91[0xf]);
    auVar71 = auVar91;
    bStack_59 = bVar86;
    auVar87 = local_2a8;
    for (uVar57 = (uint)(ushort)((ushort)(SUB161(auVar74 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar74 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar74 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar74 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar74 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar74 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar74 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar74 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar74 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar74 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar74 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar74 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar74 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar74 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar74 >> 0x77,0) & 1) << 0xe); local_2a8 = auVar71
        , uVar57 != 0; uVar57 = uVar57 - 1 & uVar57) {
      uVar16 = 0;
      if (uVar57 != 0) {
        for (; (uVar57 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
        }
      }
      uVar54 = (ulong)uVar16;
      if (sVar50 == ppVar27[(long)pgVar49 * 0xf + uVar54].first._M_len) {
        local_2f8._0_8_ = ppVar27 + (long)pgVar49 * 0xf + uVar54;
        if (sVar50 == 0) goto LAB_0075fe87;
        iVar31 = bcmp((void *)local_288._0_8_,ppVar27[(long)pgVar49 * 0xf + uVar54].first._M_str,
                      sVar50);
        auVar91 = local_2a8;
        if (iVar31 == 0) goto LAB_0075fe87;
      }
      auVar71 = local_2a8;
      auVar87 = local_2a8;
    }
    local_2a8 = auVar87;
    if ((*(byte *)&(((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                      *)((long)local_2c0 + 0x92f898))->first)._M_str & bVar86) == 0) break;
  }
  if ((this->instanceOverrides).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
      .size_ctrl.size <
      (this->instanceOverrides).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
      .size_ctrl.ml) {
    in_R9.values_ = (value<fmt::v11::context> *)&local_338;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
              ((locator *)&local_268._M_value,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                *)local_1f8,(arrays_type *)local_1f8,(size_t)local_290,(size_t)local_2d8,
               (try_emplace_args_t *)in_R9.values_,&local_310);
    psVar2 = &(this->instanceOverrides).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
              .size_ctrl.size;
    *psVar2 = *psVar2 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
              ((locator *)&local_268._M_value,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                *)local_1f8,(size_t)local_2d8,(try_emplace_args_t *)&local_338,&local_310);
  }
  local_2f8._0_8_ = local_258;
LAB_0075fe87:
  sVar10 = (local_278->parameters).
           super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len;
  if (sVar10 != 0) {
    pPVar42 = (local_278->parameters).
              super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.data_;
    local_150 = &pPVar42->field_0 + sVar10;
    uVar32 = 0;
    do {
      local_2c0 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                   *)CONCAT44(local_2c0._4_4_,uVar32);
      uVar28 = local_2f8._0_8_;
      local_2d0 = pPVar42;
      local_338._0_16_ = parsing::Token::valueText((Token *)&((pPVar42->field_0).valueSyntax)->type)
      ;
      local_2a8._0_8_ = local_338._M_dataplus._M_p;
      local_1d0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                   *)(uVar28 + 0x10);
      local_1d8 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                            ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                             local_1d0,
                             (basic_string_view<char,_std::char_traits<char>_> *)&local_338);
      uVar54 = local_1d8 >>
               ((byte)(((flat_hash_map<const_SourceLibrary_*,_ConfigRule_*> *)
                       &((InstanceOverride *)(uVar28 + 0x10))->childNodes)->table_).
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                      .arrays.groups_size_index & 0x3f);
      local_300 = (value_type_pointer)uVar28;
      local_290 = (((flat_hash_map<const_SourceLibrary_*,_ConfigRule_*> *)
                   &((InstanceOverride *)(uVar28 + 0x10))->childNodes)->table_).
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                  .arrays.groups_;
      uVar32 = (&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                 word)[local_1d8 & 0xff];
      auVar92._4_4_ = uVar32;
      auVar92._0_4_ = uVar32;
      auVar92._8_4_ = uVar32;
      auVar92._12_4_ = uVar32;
      _Var26._M_p = local_338._M_dataplus._M_p;
      local_2f8._0_8_ = local_338._M_string_length;
      local_2b0 = (SyntaxNode *)(ulong)((uint)local_1d8 & 7);
      uVar39 = 0;
      local_148 = uVar54;
      do {
        pgVar49 = local_290 + uVar54;
        local_78 = pgVar49->m[0].n;
        uStack_77 = pgVar49->m[1].n;
        uStack_76 = pgVar49->m[2].n;
        uStack_75 = pgVar49->m[3].n;
        uStack_74 = pgVar49->m[4].n;
        uStack_73 = pgVar49->m[5].n;
        uStack_72 = pgVar49->m[6].n;
        uStack_71 = pgVar49->m[7].n;
        uStack_70 = pgVar49->m[8].n;
        uStack_6f = pgVar49->m[9].n;
        uStack_6e = pgVar49->m[10].n;
        uStack_6d = pgVar49->m[0xb].n;
        uStack_6c = pgVar49->m[0xc].n;
        uStack_6b = pgVar49->m[0xd].n;
        uStack_6a = pgVar49->m[0xe].n;
        uStack_69 = pgVar49->m[0xf].n;
        auVar75[0] = -(local_78 == auVar92[0]);
        auVar75[1] = -(uStack_77 == auVar92[1]);
        auVar75[2] = -(uStack_76 == auVar92[2]);
        auVar75[3] = -(uStack_75 == auVar92[3]);
        auVar75[4] = -(uStack_74 == auVar92[4]);
        auVar75[5] = -(uStack_73 == auVar92[5]);
        auVar75[6] = -(uStack_72 == auVar92[6]);
        auVar75[7] = -(uStack_71 == auVar92[7]);
        auVar75[8] = -(uStack_70 == auVar92[8]);
        auVar75[9] = -(uStack_6f == auVar92[9]);
        auVar75[10] = -(uStack_6e == auVar92[10]);
        auVar75[0xb] = -(uStack_6d == auVar92[0xb]);
        auVar75[0xc] = -(uStack_6c == auVar92[0xc]);
        auVar75[0xd] = -(uStack_6b == auVar92[0xd]);
        auVar75[0xe] = -(uStack_6a == auVar92[0xe]);
        auVar75[0xf] = -(uStack_69 == auVar92[0xf]);
        local_2d8 = (group_type_pointer)CONCAT71(local_2d8._1_7_,uStack_69);
        uVar57 = (uint)(ushort)((ushort)(SUB161(auVar75 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar75 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar75 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar75 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar75 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar75 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar75 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar75 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar75 >> 0x77,0) & 1) << 0xe);
        if (uVar57 != 0) {
          ppVar11 = (((flat_hash_map<const_SourceLibrary_*,_ConfigRule_*> *)
                     &(local_300->second).childNodes)->table_).
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                    .arrays.elements_;
          local_288 = auVar92;
          do {
            uVar16 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
              }
            }
            uVar53 = (ulong)uVar16;
            if (_Var26._M_p == *(pointer *)((long)ppVar11 + (uVar54 * 0xf + uVar53) * 0x48)) {
              SVar35 = (SourceLocation)((long)ppVar11 + (uVar54 * 0xf + uVar53) * 0x48);
              if (_Var26._M_p == (pointer)0x0) goto LAB_007600ae;
              iVar31 = bcmp((void *)local_2f8._0_8_,
                            *(void **)((long)ppVar11 + (uVar54 * 0xf + uVar53) * 0x48 + 8),
                            (size_t)_Var26._M_p);
              auVar92 = local_288;
              if (iVar31 == 0) goto LAB_007600ae;
            }
            uVar57 = uVar57 - 1 & uVar57;
          } while (uVar57 != 0);
        }
        ppVar27 = local_300;
        if ((*(byte *)&local_2b0[0x61fb1].parent & (byte)local_2d8) == 0) break;
        uVar53 = (((flat_hash_map<const_SourceLibrary_*,_ConfigRule_*> *)
                  &(local_300->second).childNodes)->table_).
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                 .arrays.groups_size_mask;
        lVar51 = uVar54 + uVar39;
        uVar39 = uVar39 + 1;
        uVar54 = lVar51 + 1U & uVar53;
      } while (uVar39 <= uVar53);
      if ((((flat_hash_map<const_SourceLibrary_*,_ConfigRule_*> *)&(local_300->second).childNodes)->
          table_).
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
          .size_ctrl.size <
          (((flat_hash_map<const_SourceLibrary_*,_ConfigRule_*> *)&(local_300->second).childNodes)->
          table_).
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
          .size_ctrl.ml) {
        in_R9.values_ = (value<fmt::v11::context> *)&local_270;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                  ((locator *)&local_268._M_value,local_1d0,(arrays_type *)local_1d0,local_148,
                   local_1d8,(try_emplace_args_t *)in_R9.values_,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_338);
        psVar2 = &(((flat_hash_map<const_SourceLibrary_*,_ConfigRule_*> *)
                   &(ppVar27->second).childNodes)->table_).
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                  .size_ctrl.size;
        *psVar2 = *psVar2 + 1;
        SVar35 = local_258;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                  ((locator *)&local_268._M_value,local_1d0,local_1d8,
                   (try_emplace_args_t *)&local_270,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_338);
        SVar35 = local_258;
      }
LAB_007600ae:
      local_2f8._0_8_ = SVar35;
      uVar32 = CONCAT31((int3)((ulong)local_2c0 >> 8),(byte)local_2c0 | local_2a8._0_8_ == 0);
      pPVar42 = (pointer)&local_2d0->field_1;
    } while (pPVar42 != (pointer)local_150);
    if (((ulong)local_2c0 & 1) != 0 || local_2a8._0_8_ == 0) goto LAB_0075f6a4;
  }
  pDVar34 = local_278;
  piVar12 = (int *)(local_278->parameters).
                   super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.cap;
  local_210 = *(SourceLocation *)(piVar12 + 2);
  local_258 = (SourceLocation)((ulong)local_258 & 0xffffffffffffff00);
  local_220 = 0;
  local_230.startLoc = (SourceLocation)0x0;
  local_230.endLoc = (SourceLocation)0x0;
  local_240._M_len = 0;
  local_240._M_str = (char *)0x0;
  local_250._M_len = 0;
  local_250._M_str = (char *)0x0;
  local_218 = (SourceLocation)0x0;
  local_208 = 0;
  if (*piVar12 == 99) {
    local_218 = *(SourceLocation *)(piVar12 + 0xc);
    if ((*(long *)(piVar12 + 10) != 0) &&
       (sVar101 = parsing::Token::valueText((Token *)(*(long *)(piVar12 + 10) + 0x38)),
       sVar101._M_len != 0)) {
      local_250 = parsing::Token::valueText((Token *)(*(long *)(piVar12 + 10) + 0x18));
      local_240 = parsing::Token::valueText((Token *)(*(long *)(piVar12 + 10) + 0x38));
      local_230 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(piVar12 + 10));
      if (*(long *)(piVar12 + 0x14) != 0) {
        local_220 = 1;
      }
    }
  }
  else {
    local_268._M_value =
         (span<const_slang::SourceLibrary_*const,_18446744073709551615UL>)
         resolve::anon_class_16_2_f7902cf0::operator()
                   (&local_1e8,*(ConfigLiblistSyntax **)(piVar12 + 0x14));
    local_258._0_1_ = 1;
  }
  pSVar25 = local_2b8;
  pSVar59 = *(SourceLocation **)(local_2f8._0_8_ + 0x40);
  if (pSVar59 == (SourceLocation *)0x0) {
    pCVar37 = BumpAllocator::emplace<slang::ast::ConfigRule,slang::ast::ConfigRule&>
                        (&local_2c8->super_BumpAllocator,(ConfigRule *)&local_268._M_value);
    *(ConfigRule **)(local_2f8._0_8_ + 0x40) = pCVar37;
  }
  else if ((((local_218 == (SourceLocation)0x0) || (pSVar59[10] == (SourceLocation)0x0)) &&
           ((local_258._0_1_ != '\x01' || (*(char *)(pSVar59 + 2) == '\0')))) &&
          ((local_240._M_len == 0 || (pSVar59[5] == (SourceLocation)0x0)))) {
    if (local_218 != (SourceLocation)0x0) {
      pSVar59[10] = local_218;
    }
    if (local_258._0_1_ != '\0') {
      pSVar59[2] = local_258;
      *pSVar59 = (SourceLocation)local_268._M_value._M_ptr;
      pSVar59[1] = (SourceLocation)local_268._M_value._M_extent._M_extent_value;
    }
    if (local_240._M_len != 0) {
      *(undefined1 *)(pSVar59 + 9) = local_220;
      pSVar59[7] = local_230.startLoc;
      pSVar59[8] = local_230.endLoc;
      *(string_view *)(pSVar59 + 5) = local_240;
      pSVar59[3] = (SourceLocation)local_250._M_len;
      pSVar59[4] = (SourceLocation)local_250._M_str;
      SVar35 = local_210;
LAB_007601f1:
      pSVar59[0xb] = SVar35;
    }
  }
  else {
    SVar102 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_210);
    pDVar36 = Scope::addDiag(pSVar25,(DiagCode)0xeb0006,SVar102);
    local_2f8._0_8_ = pSVar59;
    local_338.field_2._M_allocated_capacity = 0x65636e6174736e69;
    local_338.field_2._8_2_ = 0x2720;
    local_338._M_string_length = 10;
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    local_338.field_2._M_local_buf[10] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_338,local_310._M_str,local_310._M_len);
    sVar10 = (pDVar34->parameters).
             super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len;
    if (sVar10 != 0) {
      pPVar42 = (pDVar34->parameters).
                super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.data_;
      lVar51 = 0;
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_338,'.');
        sVar101 = parsing::Token::valueText
                            ((Token *)(*(long *)((long)&pPVar42->field_0 + lVar51) + 0x28));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_338,sVar101._M_str,sVar101._M_len);
        lVar51 = lVar51 + 8;
      } while (sVar10 << 3 != lVar51);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_338,'\'');
    pDVar36 = Diagnostic::operator<<(pDVar36,&local_338);
    uVar28 = local_2f8._0_8_;
    if ((string_view *)local_338._M_dataplus._M_p != (string_view *)&local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    SVar102 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(uVar28 + 0x58));
    Diagnostic::addNote(pDVar36,(DiagCode)0xa0001,SVar102);
  }
LAB_0075f6a4:
  local_2e0 = (Token *)((long)local_2e0 + 8);
  if (local_2e0 == (Token *)local_2e8) goto LAB_0075ee5b;
  goto LAB_0075f3a6;
code_r0x007605dd:
  bVar86 = puVar33[-1];
  ppVar44 = (table_element_pointer)(ulong)bVar86;
  iVar97.p_ = ppVar60;
  iVar97.pc_ = puVar62 + 1;
  puVar41 = puVar41 + 1;
  puVar62 = puVar33 + 1;
  if (bVar86 != 0) goto code_r0x007605ee;
  goto LAB_007605ce;
code_r0x007605ee:
  if (bVar86 == 1) goto LAB_0075ee78;
  iVar97.pc_ = puVar33 + -1;
  goto LAB_007605b7;
code_r0x00760cd8:
  iVar103.p_ = ppVar66;
  iVar103.pc_ = puVar47 + 1;
  puVar43 = puVar43 + 1;
  puVar47 = puVar40 + 1;
  if (puVar40[-1] != '\0') goto code_r0x00760ce9;
  goto LAB_00760cca;
code_r0x00760ce9:
  if (puVar40[-1] == '\x01') goto LAB_00760b30;
  iVar103.pc_ = puVar40 + -1;
  goto LAB_00760b6f;
code_r0x0075ef2e:
  if (puVar33[-1] != '\x01') {
    iVar99.pc_ = puVar33 + -1;
    goto LAB_0075eef3;
  }
  goto LAB_0075ef97;
}

Assistant:

void ConfigBlockSymbol::resolve() const {
    SLANG_ASSERT(!resolved);
    resolved = true;

    auto scope = getParentScope();
    SLANG_ASSERT(getSyntax() && scope);

    auto& comp = scope->getCompilation();
    auto& syntax = getSyntax()->as<ConfigDeclarationSyntax>();

    SmallMap<std::string_view, size_t, 2> topCellNames;
    SmallVector<TopCell> topCellsBuf;
    for (auto cellId : syntax.topCells) {
        auto cellName = cellId->cell.valueText();
        if (!cellName.empty()) {
            auto def = comp.getDefinition(*this, cellName, cellId->library.valueText(),
                                          cellId->sourceRange());
            if (!def)
                continue;

            auto [it, inserted] = topCellNames.emplace(cellName, topCellsBuf.size());
            if (inserted)
                topCellsBuf.emplace_back(*def, cellId->sourceRange());
            else
                scope->addDiag(diag::ConfigDupTop, cellId->cell.range()) << cellName;
        }
    }

    auto buildLiblist = [&](const ConfigLiblistSyntax& cll) {
        SmallVector<const SourceLibrary*> buf;
        for (auto token : cll.libraries) {
            if (auto name = token.valueText(); !name.empty()) {
                if (auto lib = comp.getSourceLibrary(name))
                    buf.push_back(lib);
                else
                    scope->addDiag(diag::WarnUnknownLibrary, token.range()) << name;
            }
        }
        return buf.copy(comp);
    };

    auto buildRule = [&](const ConfigRuleClauseSyntax& rule) {
        ConfigRule result(*rule.parent);
        if (rule.kind == SyntaxKind::ConfigUseClause) {
            auto& cuc = rule.as<ConfigUseClauseSyntax>();
            result.paramOverrides = cuc.paramAssignments;
            if (cuc.name && !cuc.name->cell.valueText().empty()) {
                result.useCell.lib = cuc.name->library.valueText();
                result.useCell.name = cuc.name->cell.valueText();
                result.useCell.sourceRange = cuc.name->sourceRange();
                if (cuc.config)
                    result.useCell.targetConfig = true;
            }
        }
        else {
            result.liblist = buildLiblist(rule.as<ConfigLiblistSyntax>());
        }
        return result;
    };

    auto mergeRules = [&](ConfigRule& curRule, const ConfigRule& newRule, auto&& nameGetter) {
        if ((bool(newRule.paramOverrides) && bool(curRule.paramOverrides)) ||
            (newRule.liblist.has_value() && curRule.liblist.has_value()) ||
            (!newRule.useCell.name.empty() && !curRule.useCell.name.empty())) {

            auto& diag = scope->addDiag(diag::DupConfigRule, newRule.syntax->sourceRange())
                         << nameGetter();
            diag.addNote(diag::NotePreviousDefinition, curRule.syntax->sourceRange());
        }
        else {
            if (newRule.paramOverrides)
                curRule.paramOverrides = newRule.paramOverrides;
            if (newRule.liblist)
                curRule.liblist = newRule.liblist;
            if (!newRule.useCell.name.empty()) {
                // Note: prefer the source range to come from the rule that
                // supplies a use cell name, to make other reported errors easier
                // to understand.
                curRule.useCell = newRule.useCell;
                curRule.syntax = newRule.syntax;
            }
        }
    };

    for (auto ruleSyntax : syntax.rules) {
        switch (ruleSyntax->kind) {
            case SyntaxKind::DefaultConfigRule:
                defaultLiblist = buildLiblist(*ruleSyntax->as<DefaultConfigRuleSyntax>().liblist);
                break;
            case SyntaxKind::CellConfigRule: {
                auto& ccr = ruleSyntax->as<CellConfigRuleSyntax>();
                auto cellName = ccr.name->cell.valueText();
                if (cellName.empty())
                    break;

                auto rule = comp.emplace<ConfigRule>(buildRule(*ccr.ruleClause));

                auto& overrides = cellOverrides[cellName];
                if (auto libName = ccr.name->library.valueText(); !libName.empty()) {
                    auto specificLib = comp.getSourceLibrary(libName);
                    if (!specificLib) {
                        scope->addDiag(diag::WarnUnknownLibrary, ccr.name->library.range())
                            << libName;
                        break;
                    }

                    auto [it, inserted] = overrides.specificLibRules.emplace(specificLib, rule);
                    if (!inserted) {
                        mergeRules(*it->second, *rule, [&] {
                            return fmt::format("cell '{}.{}'", specificLib->name, cellName);
                        });
                    }
                }
                else if (overrides.defaultRule) {
                    mergeRules(*overrides.defaultRule, *rule,
                               [&] { return fmt::format("cell '{}'", cellName); });
                }
                else {
                    overrides.defaultRule = rule;
                }
                break;
            }
            case SyntaxKind::InstanceConfigRule: {
                auto& icr = ruleSyntax->as<InstanceConfigRuleSyntax>();
                const auto topName = icr.topModule.valueText();
                if (topName.empty())
                    break;

                if (!topCellNames.contains(topName)) {
                    scope->addDiag(diag::ConfigInstanceWrongTop, icr.topModule.range());
                    break;
                }

                bool bad = false;
                auto node = &instanceOverrides[topName];
                for (auto& part : icr.instanceNames) {
                    auto partName = part->name.valueText();
                    bad |= partName.empty();
                    node = &node->childNodes[partName];
                }

                if (bad)
                    break;

                auto rule = buildRule(*icr.ruleClause);
                if (!node->rule) {
                    // No rule here yet; copy into our allocator and save it.
                    node->rule = comp.emplace<ConfigRule>(rule);
                }
                else {
                    // Merge the two rules, or warn if we cannot.
                    mergeRules(*node->rule, rule, [&] {
                        std::string name = "instance '";
                        name += topName;
                        for (auto& part : icr.instanceNames) {
                            name.push_back('.');
                            name += part->name.valueText();
                        }
                        name.push_back('\'');
                        return name;
                    });
                }
                break;
            }
            default:
                SLANG_UNREACHABLE;
        }
    }

    auto checkTopOverride = [&](const ConfigRule& rule) {
        if (!rule.useCell.name.empty())
            scope->addDiag(diag::ConfigOverrideTop, rule.syntax->sourceRange());
    };

    // Check if any overrides should apply to the root instances.
    for (auto& [cellName, instOverride] : instanceOverrides) {
        if (instOverride.rule) {
            auto it = topCellNames.find(cellName);
            SLANG_ASSERT(it != topCellNames.end());
            checkTopOverride(*instOverride.rule);
            topCellsBuf[it->second].rule = instOverride.rule;
        }
    }

    for (auto& topCell : topCellsBuf) {
        // If we already set a rule for this cell via an instance
        // override we don't need a less specific cell override.
        if (topCell.rule)
            continue;

        if (auto it = cellOverrides.find(topCell.definition.name); it != cellOverrides.end()) {
            topCell.rule = it->second.defaultRule;
            auto& specificLibRules = it->second.specificLibRules;
            if (auto specificIt = specificLibRules.find(&topCell.definition.sourceLibrary);
                specificIt != specificLibRules.end()) {
                topCell.rule = specificIt->second;
            }

            if (topCell.rule)
                checkTopOverride(*topCell.rule);
        }
    }

    topCells = topCellsBuf.copy(comp);

    // Now that all rules have been resolved, go back through and
    // register them for later lookup by syntax.
    for (auto& [_, cellOverride] : cellOverrides) {
        if (cellOverride.defaultRule)
            ruleBySyntax[cellOverride.defaultRule->syntax] = cellOverride.defaultRule;

        for (auto& [lib, rule] : cellOverride.specificLibRules)
            ruleBySyntax[rule->syntax] = rule;
    }

    for (auto& [_, instOverride] : getInstanceOverrides())
        registerRules(instOverride);
}